

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cc
# Opt level: O3

void __thiscall tt::LogFile::LogFile(LogFile *this,string *basename,int flushEveryN)

{
  pointer pcVar1;
  pthread_mutex_t *__mutex;
  AppendFile *this_00;
  pointer *__ptr;
  string local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &(this->m_basename).field_2;
  (this->m_basename)._M_dataplus._M_p = (pointer)local_38;
  pcVar1 = (basename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + basename->_M_string_length);
  this->m_flushEveryN = flushEveryN;
  this->m_count = 0;
  __mutex = (pthread_mutex_t *)operator_new(0x30);
  pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
  (this->m_mutex)._M_t.super___uniq_ptr_impl<tt::MutexLock,_std::default_delete<tt::MutexLock>_>.
  _M_t.super__Tuple_impl<0UL,_tt::MutexLock_*,_std::default_delete<tt::MutexLock>_>.
  super__Head_base<0UL,_tt::MutexLock_*,_false>._M_head_impl = (MutexLock *)__mutex;
  (this->m_file)._M_t.
  super___uniq_ptr_impl<tt::FileUtil::AppendFile,_std::default_delete<tt::FileUtil::AppendFile>_>.
  _M_t.
  super__Tuple_impl<0UL,_tt::FileUtil::AppendFile_*,_std::default_delete<tt::FileUtil::AppendFile>_>
  .super__Head_base<0UL,_tt::FileUtil::AppendFile_*,_false>._M_head_impl = (AppendFile *)0x0;
  this_00 = (AppendFile *)operator_new(0x10008);
  pcVar1 = (basename->_M_dataplus)._M_p;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + basename->_M_string_length);
  FileUtil::AppendFile::AppendFile(this_00,&local_58);
  std::__uniq_ptr_impl<tt::FileUtil::AppendFile,_std::default_delete<tt::FileUtil::AppendFile>_>::
  reset((__uniq_ptr_impl<tt::FileUtil::AppendFile,_std::default_delete<tt::FileUtil::AppendFile>_> *
        )&this->m_file,this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return;
}

Assistant:

tt::LogFile::LogFile(const std::string& basename, int flushEveryN)
	:m_basename(basename),
	m_flushEveryN(flushEveryN),
	m_count(0),
	m_mutex(new MutexLock){
	
	m_file.reset(new FileUtil::AppendFile(basename));	
}